

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_base.cpp
# Opt level: O3

QByteArray *
QTlsPrivate::X509CertificateBase::subjectInfoToString
          (QByteArray *__return_storage_ptr__,SubjectInfo info)

{
  char *pcVar1;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  switch(info) {
  case Organization:
    pcVar1 = "O";
    break;
  case CommonName:
    pcVar1 = "CN";
    break;
  case LocalityName:
    pcVar1 = "L";
    break;
  case OrganizationalUnitName:
    pcVar1 = "OU";
    break;
  case CountryName:
    pcVar1 = "C";
    break;
  case StateOrProvinceName:
    pcVar1 = "ST";
    break;
  case DistinguishedNameQualifier:
    pcVar1 = "dnQualifier";
    break;
  case SerialNumber:
    pcVar1 = "serialNumber";
    break;
  case EmailAddress:
    pcVar1 = "emailAddress";
    break;
  default:
    goto switchD_00104dcf_default;
  }
  QByteArray::QByteArray(&local_38,pcVar1,-1);
  *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
  (__return_storage_ptr__->d).size = local_38.d.size;
switchD_00104dcf_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray X509CertificateBase::subjectInfoToString(QSslCertificate::SubjectInfo info)
{
    QByteArray str;
    switch (info) {
    case QSslCertificate::Organization: str = QByteArray("O"); break;
    case QSslCertificate::CommonName: str = QByteArray("CN"); break;
    case QSslCertificate::LocalityName: str = QByteArray("L"); break;
    case QSslCertificate::OrganizationalUnitName: str = QByteArray("OU"); break;
    case QSslCertificate::CountryName: str = QByteArray("C"); break;
    case QSslCertificate::StateOrProvinceName: str = QByteArray("ST"); break;
    case QSslCertificate::DistinguishedNameQualifier: str = QByteArray("dnQualifier"); break;
    case QSslCertificate::SerialNumber: str = QByteArray("serialNumber"); break;
    case QSslCertificate::EmailAddress: str = QByteArray("emailAddress"); break;
    }

    return str;
}